

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

bool tinyusdz::ConvertTokenAttributeToStringAttribute
               (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *inp,
               TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *out)

{
  double t;
  bool bVar1;
  AttrMeta *pAVar2;
  AttrMeta *this;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *paths;
  TypedTimeSamples<tinyusdz::Token> *pTVar3;
  vector<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
  *this_00;
  reference pSVar4;
  string *psVar5;
  Sample *item;
  const_iterator __end7;
  const_iterator __begin7;
  vector<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
  *__range7;
  TypedTimeSamples<tinyusdz::Token> tok_ts;
  token tok;
  Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> strs;
  Animatable<tinyusdz::Token> toks;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *out_local;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *inp_local;
  
  pAVar2 = TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::metas(inp);
  this = TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::metas(out);
  AttrMetas::operator=(this,pAVar2);
  bVar1 = TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::is_blocked(inp);
  if (bVar1) {
    TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set_blocked(out,true);
  }
  else {
    bVar1 = TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::is_value_empty(inp);
    if (bVar1) {
      TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set_value_empty(out);
    }
    else {
      bVar1 = TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::is_connection(inp);
      if (bVar1) {
        paths = TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::get_connections(inp);
        TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set_connections(out,paths);
      }
      else {
        Animatable<tinyusdz::Token>::Animatable((Animatable<tinyusdz::Token> *)&strs._ts._dirty);
        Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Animatable((Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)&tok.str_.field_2 + 8));
        bVar1 = TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::get_value
                          (inp,(Animatable<tinyusdz::Token> *)&strs._ts._dirty);
        if (bVar1) {
          bVar1 = Animatable<tinyusdz::Token>::is_scalar
                            ((Animatable<tinyusdz::Token> *)&strs._ts._dirty);
          if (bVar1) {
            Token::Token((Token *)&tok_ts._dirty);
            Animatable<tinyusdz::Token>::get_scalar
                      ((Animatable<tinyusdz::Token> *)&strs._ts._dirty,(Token *)&tok_ts._dirty);
            psVar5 = Token::str_abi_cxx11_((Token *)&tok_ts._dirty);
            Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::set((Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)((long)&tok.str_.field_2 + 8),psVar5);
            Token::~Token((Token *)&tok_ts._dirty);
            goto LAB_003864bd;
          }
          bVar1 = Animatable<tinyusdz::Token>::is_timesamples
                            ((Animatable<tinyusdz::Token> *)&strs._ts._dirty);
          if (bVar1) {
            pTVar3 = Animatable<tinyusdz::Token>::get_timesamples
                               ((Animatable<tinyusdz::Token> *)&strs._ts._dirty);
            TypedTimeSamples<tinyusdz::Token>::TypedTimeSamples
                      ((TypedTimeSamples<tinyusdz::Token> *)&__range7,pTVar3);
            this_00 = TypedTimeSamples<tinyusdz::Token>::get_samples
                                ((TypedTimeSamples<tinyusdz::Token> *)&__range7);
            __end7 = ::std::
                     vector<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
                     ::begin(this_00);
            item = (Sample *)
                   ::std::
                   vector<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
                   ::end(this_00);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end7,(__normal_iterator<const_tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>_>
                                               *)&item), bVar1) {
              pSVar4 = __gnu_cxx::
                       __normal_iterator<const_tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>_>
                       ::operator*(&__end7);
              t = pSVar4->t;
              psVar5 = Token::str_abi_cxx11_(&pSVar4->value);
              Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::add_sample((Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)((long)&tok.str_.field_2 + 8),t,psVar5);
              __gnu_cxx::
              __normal_iterator<const_tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>_>
              ::operator++(&__end7);
            }
            TypedTimeSamples<tinyusdz::Token>::~TypedTimeSamples
                      ((TypedTimeSamples<tinyusdz::Token> *)&__range7);
            goto LAB_003864bd;
          }
          bVar1 = Animatable<tinyusdz::Token>::is_blocked
                            ((Animatable<tinyusdz::Token> *)&strs._ts._dirty);
          if (!bVar1) goto LAB_003864bd;
          inp_local._7_1_ = 0;
          bVar1 = true;
        }
        else {
LAB_003864bd:
          TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::set_value(out,(Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)((long)&tok.str_.field_2 + 8));
          bVar1 = false;
        }
        Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Animatable((Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)((long)&tok.str_.field_2 + 8));
        Animatable<tinyusdz::Token>::~Animatable((Animatable<tinyusdz::Token> *)&strs._ts._dirty);
        if (bVar1) goto LAB_00386504;
      }
    }
  }
  inp_local._7_1_ = 1;
LAB_00386504:
  return (bool)(inp_local._7_1_ & 1);
}

Assistant:

bool ConvertTokenAttributeToStringAttribute(
    const TypedAttribute<Animatable<value::token>> &inp,
    TypedAttribute<Animatable<std::string>> &out) {
  
    out.metas() = inp.metas();
  
    if (inp.is_blocked()) {
      out.set_blocked(true);
    } else if (inp.is_value_empty()) {
      out.set_value_empty();
    } else if (inp.is_connection()) {
      out.set_connections(inp.get_connections());
    } else {
      Animatable<value::token> toks;
      Animatable<std::string> strs;
      if (inp.get_value(&toks)) {
        if (toks.is_scalar()) {
          value::token tok;
          toks.get_scalar(&tok);
          strs.set(tok.str());
        } else if (toks.is_timesamples()) {
          auto tok_ts = toks.get_timesamples();
  
          for (auto &item : tok_ts.get_samples()) {
            strs.add_sample(item.t, item.value.str());
          }
        } else if (toks.is_blocked()) {
          // TODO
          return false;
        }
      }
      out.set_value(strs);
    }
  
    return true;
  }